

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::ReplayPropertyEnumEvent
          (EventLog *this,ScriptContext *requestContext,BOOL *returnCode,BigPropertyIndex *newIndex,
          DynamicObject *obj,PropertyId *pid,PropertyAttributes *attributes,
          JavascriptString **propertyName)

{
  BOOL BVar1;
  int iVar2;
  PropertyEnumStepEventLogEntry *pPVar3;
  PropertyString *pPVar4;
  PropertyRecord *pPVar5;
  DynamicType *pDVar6;
  DynamicTypeHandler *pDVar7;
  PropertyRecord *pRecord;
  PropertyString *propertyString;
  PropertyEnumStepEventLogEntry *peEvent;
  PropertyId *pid_local;
  DynamicObject *obj_local;
  BigPropertyIndex *newIndex_local;
  BOOL *returnCode_local;
  ScriptContext *requestContext_local;
  EventLog *this_local;
  
  pPVar3 = ReplayGetReplayEvent_Helper<TTD::NSLogEvents::PropertyEnumStepEventLogEntry,(TTD::NSLogEvents::EventKind)8>
                     (this);
  *returnCode = pPVar3->ReturnCode;
  *pid = pPVar3->Pid;
  *attributes = pPVar3->Attributes;
  if (*returnCode == 0) {
    *propertyName = (JavascriptString *)0x0;
    pDVar6 = Js::DynamicObject::GetDynamicType(obj);
    pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
    iVar2 = (*pDVar7->_vptr_DynamicTypeHandler[6])();
    *newIndex = iVar2;
  }
  else {
    if (*pid == -1) {
      TTDAbort_unrecoverable_error("This is so weird we need to figure out what this means.");
    }
    BVar1 = Js::IsInternalPropertyId(*pid);
    if (BVar1 != 0) {
      TTDAbort_unrecoverable_error("We should skip recording this.");
    }
    pPVar4 = Js::ScriptContext::GetPropertyString(requestContext,*pid);
    *propertyName = &pPVar4->super_JavascriptString;
    pPVar5 = Js::ScriptContext::GetPropertyName(requestContext,*pid);
    pDVar6 = Js::DynamicObject::GetDynamicType(obj);
    pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
    iVar2 = (*pDVar7->_vptr_DynamicTypeHandler[0x66])(pDVar7,pPVar5);
    *newIndex = iVar2;
    if (*newIndex == -1) {
      TTDAbort_unrecoverable_error
                ("If *returnCode is true then we found it during record -- but missing in replay.");
    }
  }
  return;
}

Assistant:

void EventLog::ReplayPropertyEnumEvent(Js::ScriptContext* requestContext, BOOL* returnCode, Js::BigPropertyIndex* newIndex, const Js::DynamicObject* obj, Js::PropertyId* pid, Js::PropertyAttributes* attributes, Js::JavascriptString** propertyName)
    {
        const NSLogEvents::PropertyEnumStepEventLogEntry* peEvent = this->ReplayGetReplayEvent_Helper<NSLogEvents::PropertyEnumStepEventLogEntry, NSLogEvents::EventKind::PropertyEnumTag>();

        *returnCode = peEvent->ReturnCode;
        *pid = peEvent->Pid;
        *attributes = peEvent->Attributes;

        if(*returnCode)
        {
            TTDAssert(*pid != Js::Constants::NoProperty, "This is so weird we need to figure out what this means.");
            TTDAssert(!Js::IsInternalPropertyId(*pid), "We should skip recording this.");

            Js::PropertyString* propertyString = requestContext->GetPropertyString(*pid);
            *propertyName = propertyString;

            const Js::PropertyRecord* pRecord = requestContext->GetPropertyName(*pid);
            *newIndex = obj->GetDynamicType()->GetTypeHandler()->GetPropertyIndex_EnumerateTTD(pRecord);

            TTDAssert(*newIndex != Js::Constants::NoBigSlot, "If *returnCode is true then we found it during record -- but missing in replay.");
        }
        else
        {
            *propertyName = nullptr;

            *newIndex = obj->GetDynamicType()->GetTypeHandler()->GetPropertyCount();
        }

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteEnumAction(this->m_eventTimeCtr - 1, *returnCode, *pid, *attributes, *propertyName);
#endif
    }